

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-simple.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  float fVar1;
  bool bVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  basic_command_line_parser<char> *this_00;
  size_type sVar5;
  ostream *poVar6;
  Scalar *pSVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  PcaModel *pPVar11;
  string *psVar12;
  basic_ostream<char,_std::char_traits<char>_> *pbVar13;
  ulong in_stack_ffffffffffffeef8;
  path local_f08;
  path local_ee8;
  vector<int,_std::allocator<int>_> local_ec8;
  core local_ea8 [96];
  _InputArray local_e48;
  path local_e30;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  undefined1 local_dd0 [8];
  path outputfile;
  Matrix4f local_d88;
  Matrix4f local_d48;
  undefined1 local_d00 [8];
  Image4u texturemap;
  vector<float,_std::allocator<float>_> local_cb8;
  undefined1 local_ca0 [8];
  Mesh mesh;
  optional<float> local_c08;
  optional<int> local_c00;
  Matrix<float,__1,_1,_0,__1,_1> local_bf8;
  Matrix<float,_3,_4,_0,_3,_4> local_be8;
  undefined1 local_bb0 [8];
  vector<float,_std::allocator<float>_> fitted_coeffs;
  undefined1 local_b48 [8];
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  float yaw_angle;
  undefined1 local_ad8 [8];
  RenderingParameters rendering_params;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_a80;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_a68;
  undefined1 local_a50 [8];
  ScaledOrthoProjectionParameters pose;
  undefined1 local_a18 [8];
  Vector3f vertex;
  int vertex_idx;
  undefined1 local_9e8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  converted_name;
  undefined1 local_9b8 [4];
  int i;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points;
  vector<int,_std::allocator<int>_> vertex_indices;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  Point_<float> local_950;
  Point_ local_948 [8];
  Point_<float> local_940;
  Point_ local_938 [8];
  _InputOutputArray local_930;
  reference local_918;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  iterator __end1;
  iterator __begin1;
  LandmarkCollection<Eigen::Vector2f> *__range1;
  Mat outimg;
  exception *e_3;
  LandmarkMapper local_870;
  undefined1 local_838 [8];
  LandmarkMapper landmark_mapper;
  runtime_error *e_2;
  MorphableModel local_7d8;
  undefined1 local_620 [8];
  MorphableModel morphable_model;
  runtime_error *e_1;
  LandmarkCollection<Eigen::Vector2f> local_440;
  undefined1 local_428 [8];
  LandmarkCollection<Eigen::Vector2f> landmarks;
  Mat image;
  int local_404;
  error *e;
  key_type local_3a0;
  basic_command_line_parser<char> local_380;
  basic_parsed_options<char> local_308;
  variables_map local_2e0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_2d0 [151];
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined8 local_178 [3];
  allocator<char> local_159;
  string local_158 [32];
  options_description local_138 [8];
  options_description desc;
  undefined1 local_b8 [8];
  string outputbasename;
  string mappingsfile;
  string landmarksfile;
  string imagefile;
  string modelfile;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(imagefile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(landmarksfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(mappingsfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outputbasename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"Allowed options",&local_159);
  boost::program_options::options_description::options_description
            (local_138,local_158,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  local_178[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_178,"help,h");
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&imagefile.field_2 + 8));
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"../share/sfm_shape_3448.bin",&local_199);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_198);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"model,m",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&landmarksfile.field_2 + 8));
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"data/image_0010.png",&local_1c1);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_1c0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"image,i",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&mappingsfile.field_2 + 8));
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"data/image_0010.pts",&local_1e9);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_1e8);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"landmarks,l",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&outputbasename.field_2 + 8));
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"../share/ibug_to_sfm.txt",&local_211);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_210);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"mapping,p",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8)
  ;
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"out",&local_239);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_238);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"output,o",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  boost::program_options::variables_map::variables_map(local_2e0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_380,argc,argv);
  this_00 = boost::program_options::basic_command_line_parser<char>::options(&local_380,local_138);
  boost::program_options::basic_command_line_parser<char>::run(&local_308,this_00);
  boost::program_options::store((basic_parsed_options *)&local_308,local_2e0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_308);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"help",(allocator<char> *)((long)&e + 7));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_2d0,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  if (sVar5 == 0) {
    boost::program_options::notify(local_2e0);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Usage: fit-model-simple [options]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    boost::program_options::operator<<((ostream *)&std::cout,local_138);
  }
  e._0_4_ = (uint)(sVar5 != 0);
  boost::program_options::variables_map::~variables_map(local_2e0);
  boost::program_options::options_description::~options_description(local_138);
  if ((uint)e == 0) {
    cv::imread((string *)
               &landmarks.
                super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)&landmarksfile + 0x18);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
              *)local_428);
    std::__cxx11::string::string((string *)&e_1,(string *)(mappingsfile.field_2._M_local_buf + 8));
    eos::core::read_pts_landmarks(&local_440,(string *)&e_1);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::operator=((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                 *)local_428,&local_440);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector(&local_440);
    std::__cxx11::string::~string((string *)&e_1);
    eos::morphablemodel::MorphableModel::MorphableModel((MorphableModel *)local_620);
    std::__cxx11::string::string((string *)&e_2,(string *)(imagefile.field_2._M_local_buf + 8));
    eos::morphablemodel::load_model(&local_7d8,(string *)&e_2);
    eos::morphablemodel::MorphableModel::operator=((MorphableModel *)local_620,&local_7d8);
    eos::morphablemodel::MorphableModel::~MorphableModel(&local_7d8);
    std::__cxx11::string::~string((string *)&e_2);
    eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)local_838);
    std::__cxx11::string::string((string *)&e_3,(string *)(outputbasename.field_2._M_local_buf + 8))
    ;
    eos::core::LandmarkMapper::LandmarkMapper(&local_870,(string *)&e_3);
    eos::core::LandmarkMapper::operator=((LandmarkMapper *)local_838,&local_870);
    eos::core::LandmarkMapper::~LandmarkMapper(&local_870);
    std::__cxx11::string::~string((string *)&e_3);
    cv::Mat::clone();
    __end1 = std::
             vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
             ::begin((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                      *)local_428);
    lm = (Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
         std::
         vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
         ::end((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                *)local_428);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                       *)&lm), bVar2) {
      local_918 = __gnu_cxx::
                  __normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                  ::operator*(&__end1);
      cv::_InputOutputArray::_InputOutputArray(&local_930,(Mat *)&__range1);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          &local_918->coordinates,0);
      fVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          &local_918->coordinates,1);
      cv::Point_<float>::Point_(&local_940,fVar1 + -2.0,*pSVar7 + -2.0);
      cv::Point_::operator_cast_to_Point_(local_938);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          &local_918->coordinates,0);
      fVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                          &local_918->coordinates,1);
      cv::Point_<float>::Point_(&local_950,fVar1 + 2.0,*pSVar7 + 2.0);
      cv::Point_::operator_cast_to_Point_(local_948);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)
                 &model_points.
                  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,255.0,0.0,0.0,0.0);
      in_stack_ffffffffffffeef8 = in_stack_ffffffffffffeef8 & 0xffffffff00000000;
      cv::rectangle(&local_930,local_938,local_948,
                    &model_points.
                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,1,8,
                    in_stack_ffffffffffffeef8);
      cv::_InputOutputArray::~_InputOutputArray(&local_930);
      __gnu_cxx::
      __normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)local_9b8);
    for (converted_name.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._36_4_ = 0;
        uVar8 = (ulong)(int)converted_name.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._36_4_,
        sVar9 = std::
                vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ::size((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                        *)local_428), uVar8 < sVar9;
        converted_name.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._36_4_ = converted_name.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._36_4_ + 1) {
      pvVar10 = std::
                vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ::operator[]((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                              *)local_428,
                             (long)(int)converted_name.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._36_4_);
      std::__cxx11::string::string
                ((string *)
                 (vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array + 2),(string *)pvVar10);
      eos::core::LandmarkMapper::convert
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_9e8,(LandmarkMapper *)local_838,
                 (string *)
                 (vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array + 2));
      std::__cxx11::string::~string
                ((string *)
                 (vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array + 2));
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_9e8);
      if (bVar2) {
        __str = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_9e8);
        vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             = (float)std::__cxx11::stoi(__str,(size_t *)0x0,10);
        pPVar11 = eos::morphablemodel::MorphableModel::get_shape_model((MorphableModel *)local_620);
        eos::morphablemodel::PcaModel::get_mean_at_point((PcaModel *)local_a18,(int)pPVar11);
        pose._40_8_ = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous
                                ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a18);
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                   (Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)&pose.ty);
        std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                  ((vector<int,std::allocator<int>> *)
                   &image_points.
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (int *)(vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array + 1));
        pvVar10 = std::
                  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                  ::operator[]((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                *)local_428,
                               (long)(int)converted_name.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._36_4_);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        emplace_back<Eigen::Matrix<float,2,1,0,2,1>&>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)local_9b8,&pvVar10->coordinates);
        e._0_4_ = 0;
      }
      else {
        e._0_4_ = 6;
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_9e8);
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_a68,
             (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)local_9b8);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector(&local_a80,
             (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::optional<int>::optional<int_&,_true>
              ((optional<int> *)&rendering_params.screen_width,(int *)&image);
    eos::fitting::estimate_orthographic_projection_linear
              ((ScaledOrthoProjectionParameters *)local_a50,&local_a68,&local_a80,true,
               (optional<int>)rendering_params._72_8_);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~vector(&local_a80);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~vector(&local_a68);
    eos::fitting::ScaledOrthoProjectionParameters::ScaledOrthoProjectionParameters
              ((ScaledOrthoProjectionParameters *)&stack0xfffffffffffff4f8,
               (ScaledOrthoProjectionParameters *)local_a50);
    eos::fitting::RenderingParameters::RenderingParameters
              ((RenderingParameters *)local_ad8,
               (ScaledOrthoProjectionParameters *)&stack0xfffffffffffff4f8,local_404,_image);
    eos::fitting::RenderingParameters::get_yaw_pitch_roll
              ((RenderingParameters *)
               (affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                m_storage.m_data.array + 10));
    Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
               (affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                m_storage.m_data.array + 10),0);
    eos::fitting::RenderingParameters::RenderingParameters
              ((RenderingParameters *)
               &fitted_coeffs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(RenderingParameters *)local_ad8);
    eos::fitting::get_3x4_affine_camera_matrix
              ((Matrix<float,_3,_4,_0,_3,_4> *)local_b48,
               (RenderingParameters *)
               &fitted_coeffs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_404,_image);
    pPVar11 = eos::morphablemodel::MorphableModel::get_shape_model((MorphableModel *)local_620);
    Eigen::Matrix<float,_3,_4,_0,_3,_4>::Matrix
              (&local_be8,(Matrix<float,_3,_4,_0,_3,_4> *)local_b48);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix(&local_bf8);
    std::optional<int>::optional(&local_c00);
    std::optional<float>::optional(&local_c08);
    std::optional<float>::optional
              ((optional<float> *)
               &mesh.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    eos::fitting::fit_shape_to_landmarks_linear
              ((vector<float,_std::allocator<float>_> *)local_bb0,pPVar11,&local_be8,
               (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                *)local_9b8,
               (vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_bf8,3.0,local_c00,
               local_c08,
               (optional<float>)
               mesh.tti.
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_bf8);
    std::vector<float,_std::allocator<float>_>::vector
              (&local_cb8,(vector<float,_std::allocator<float>_> *)local_bb0);
    texturemap.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &texturemap.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this);
    eos::morphablemodel::MorphableModel::draw_sample
              ((Mesh *)local_ca0,(MorphableModel *)local_620,&local_cb8,
               (vector<float,_std::allocator<float>_> *)this);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &texturemap.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<float,_std::allocator<float>_>::~vector(&local_cb8);
    eos::fitting::RenderingParameters::get_modelview(&local_d48,(RenderingParameters *)local_ad8);
    eos::fitting::RenderingParameters::get_projection(&local_d88,(RenderingParameters *)local_ad8);
    eos::core::from_mat_with_alpha
              ((Image4u *)((long)&outputfile.m_pathname.field_2 + 8),
               (Mat *)&landmarks.
                       super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eos::render::extract_texture
              ((Image4u *)local_d00,(Mesh *)local_ca0,&local_d48,&local_d88,Orthographic,
               (Image4u *)((long)&outputfile.m_pathname.field_2 + 8),0x200);
    eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image
              ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
               ((long)&outputfile.m_pathname.field_2 + 8));
    std::operator+(&local_df0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   ".obj");
    boost::filesystem::path::path((path *)local_dd0,&local_df0);
    std::__cxx11::string::~string((string *)&local_df0);
    psVar12 = boost::filesystem::path::string_abi_cxx11_((path *)local_dd0);
    std::__cxx11::string::string((string *)&local_e10,(string *)psVar12);
    eos::core::write_textured_obj((Mesh *)local_ca0,&local_e10);
    std::__cxx11::string::~string((string *)&local_e10);
    boost::filesystem::path::path(&local_e30,".texture.png");
    boost::filesystem::path::replace_extension((path *)local_dd0);
    boost::filesystem::path::~path(&local_e30);
    psVar12 = boost::filesystem::path::string_abi_cxx11_((path *)local_dd0);
    eos::core::to_mat(local_ea8,(Image4u *)local_d00);
    cv::_InputArray::_InputArray(&local_e48,(Mat *)local_ea8);
    local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_ec8);
    cv::imwrite((string *)psVar12,&local_e48,(vector *)&local_ec8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_ec8);
    cv::_InputArray::~_InputArray(&local_e48);
    cv::Mat::~Mat((Mat *)local_ea8);
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Finished fitting and wrote result mesh and texture to files with basename "
                            );
    boost::filesystem::path::stem();
    boost::filesystem::path::stem();
    pbVar13 = boost::filesystem::operator<<(poVar6,&local_ee8);
    poVar6 = std::operator<<(pbVar13,".");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    boost::filesystem::path::~path(&local_ee8);
    boost::filesystem::path::~path(&local_f08);
    e._0_4_ = 1;
    boost::filesystem::path::~path((path *)local_dd0);
    eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image
              ((Image<eos::core::Pixel<unsigned_char,_4>_> *)local_d00);
    eos::core::Mesh::~Mesh((Mesh *)local_ca0);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_bb0);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               *)local_9b8);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat((Mat *)&__range1);
    eos::core::LandmarkMapper::~LandmarkMapper((LandmarkMapper *)local_838);
    eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)local_620);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
               *)local_428);
    cv::Mat::~Mat((Mat *)&landmarks.
                          super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(outputbasename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mappingsfile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(landmarksfile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(imagefile.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    string modelfile, imagefile, landmarksfile, mappingsfile, outputbasename;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<string>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<string>(&imagefile)->required()->default_value("data/image_0010.png"),
                "an input image")
            ("landmarks,l", po::value<string>(&landmarksfile)->required()->default_value("data/image_0010.pts"),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<string>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("output,o", po::value<string>(&outputbasename)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-simple [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    Mat image = cv::imread(imagefile);
    LandmarkCollection<Eigen::Vector2f> landmarks;
    try
    {
        landmarks = core::read_pts_landmarks(landmarksfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map 2D landmark points (e.g. from the ibug scheme) to vertex ids:
    core::LandmarkMapper landmark_mapper;
    try
    {
        landmark_mapper = core::LandmarkMapper(mappingsfile);
    } catch (const std::exception& e)
    {
        cout << "Error loading the landmark mappings: " << e.what() << endl;
        return EXIT_FAILURE;
    }

    // Draw the loaded landmarks:
    Mat outimg = image.clone();
    for (auto&& lm : landmarks)
    {
        cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                      cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
    }

    // These will be the final 2D and 3D points used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices;    // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const auto converted_name = landmark_mapper.convert(landmarks[i].name);
        if (!converted_name)
        { // no mapping defined for the current landmark
            continue;
        }
        const int vertex_idx = std::stoi(converted_name.value());
        const auto vertex = morphable_model.get_shape_model().get_mean_at_point(vertex_idx);
        model_points.emplace_back(vertex.homogeneous());
        vertex_indices.emplace_back(vertex_idx);
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Estimate the camera (pose) from the 2D - 3D point correspondences
    fitting::ScaledOrthoProjectionParameters pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image.rows);
    fitting::RenderingParameters rendering_params(pose, image.cols, image.rows);

    // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw, pitch,
    // and roll angles:
    const float yaw_angle = rendering_params.get_yaw_pitch_roll()[0];

    // Estimate the shape coefficients by fitting the shape to the landmarks:
    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image.cols, image.rows);
    const vector<float> fitted_coeffs = fitting::fit_shape_to_landmarks_linear(
        morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices);

    // Obtain the full mesh with the estimated coefficients:
    const core::Mesh mesh = morphable_model.draw_sample(fitted_coeffs, vector<float>());

    // Extract the texture from the image using given mesh and camera parameters:
    const core::Image4u texturemap =
        render::extract_texture(mesh, rendering_params.get_modelview(), rendering_params.get_projection(),
                                render::ProjectionType::Orthographic, core::from_mat_with_alpha(image));

    // Save the mesh as textured obj:
    fs::path outputfile = outputbasename + ".obj";
    core::write_textured_obj(mesh, outputfile.string());

    // And save the texture map:
    outputfile.replace_extension(".texture.png");
    cv::imwrite(outputfile.string(), core::to_mat(texturemap));

    cout << "Finished fitting and wrote result mesh and texture to files with basename "
         << outputfile.stem().stem() << "." << endl;

    return EXIT_SUCCESS;
}